

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

char * fmt::v10::detail::parse_dynamic_spec<char>
                 (char *begin,char *end,int *value,arg_ref<char> *ref,
                 basic_format_parse_context<char> *ctx)

{
  undefined1 local_78 [8];
  dynamic_spec_id_handler<char> handler;
  int val;
  basic_format_parse_context<char> *ctx_local;
  arg_ref<char> *ref_local;
  int *value_local;
  char *end_local;
  char *begin_local;
  char local_29;
  dynamic_spec_id_handler<char> *pdStack_28;
  char c;
  char *local_20;
  char *local_18;
  char *local_10;
  
  end_local = begin;
  if (begin == end) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Optiroc[P]SuperFamiconv/include/fmt/core.h"
                ,0x8e3,"");
  }
  if ((*begin < '0') || ('9' < *begin)) {
    if (*begin == '{') {
      end_local = begin + 1;
      local_78 = (undefined1  [8])ctx;
      handler.ctx = (basic_format_parse_context<char> *)ref;
      if (end_local != end) {
        pdStack_28 = (dynamic_spec_id_handler<char> *)local_78;
        local_20 = end;
        local_18 = end_local;
        if (end_local == end) {
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Optiroc[P]SuperFamiconv/include/fmt/core.h"
                      ,0x8c2,"");
        }
        local_29 = *end_local;
        if ((local_29 == '}') || (local_29 == ':')) {
          dynamic_spec_id_handler<char>::on_auto(pdStack_28);
          local_10 = local_18;
        }
        else {
          local_10 = do_parse_arg_id<char,fmt::v10::detail::dynamic_spec_id_handler<char>&>
                               (end_local,end,pdStack_28);
        }
        end_local = local_10;
      }
      if ((end_local != end) && (*end_local == '}')) {
        return end_local + 1;
      }
      throw_format_error("invalid format string");
    }
  }
  else {
    handler.ref._4_4_ = parse_nonnegative_int<char>(&end_local,end,-1);
    if (handler.ref._4_4_ == -1) {
      throw_format_error("number is too big");
    }
    *value = handler.ref._4_4_;
  }
  return end_local;
}

Assistant:

FMT_CONSTEXPR auto parse_dynamic_spec(const Char* begin, const Char* end,
                                      int& value, arg_ref<Char>& ref,
                                      basic_format_parse_context<Char>& ctx)
    -> const Char* {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    int val = parse_nonnegative_int(begin, end, -1);
    if (val != -1)
      value = val;
    else
      throw_format_error("number is too big");
  } else if (*begin == '{') {
    ++begin;
    auto handler = dynamic_spec_id_handler<Char>{ctx, ref};
    if (begin != end) begin = parse_arg_id(begin, end, handler);
    if (begin != end && *begin == '}') return ++begin;
    throw_format_error("invalid format string");
  }
  return begin;
}